

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stripctrl.c
# Opt level: O2

void stripctrl_term_BinarySink_write(BinarySink *bs,void *vp,size_t len)

{
  undefined1 *puVar1;
  unsigned_long uVar2;
  size_t sVar3;
  unsigned_long wc;
  bool bVar4;
  
  bVar4 = true;
  if (*(char *)((long)&bs[-3].binarysink_[0xc].binarysink_ + 1) == '\0') {
    bVar4 = *(int *)(bs[-3].binarysink_[0xb5].writefmtv + 8) == 0x37;
  }
  if ((bool)*(char *)&bs[-2].write != bVar4) {
    *(bool *)&bs[-2].write = bVar4;
    *(undefined4 *)((long)&bs[-2].write + 4) = 0;
  }
  puVar1 = (undefined1 *)((long)&bs[-2].write + 4);
  for (sVar3 = 0; len != sVar3; sVar3 = sVar3 + 1) {
    uVar2 = (*(code *)bs[-2].binarysink_)
                      (bs[-3].binarysink_,puVar1,*(undefined1 *)((long)vp + sVar3));
    if (uVar2 == 0x80000021) {
      stripctrl_term_put_wc((StripCtrlCharsImpl *)&bs[-7].binarysink_,0xfffd);
      uVar2 = (*(code *)bs[-2].binarysink_)
                        (bs[-3].binarysink_,puVar1,*(undefined1 *)((long)vp + sVar3));
    }
    if (uVar2 != 0x8000003f) {
      wc = 0xfffd;
      if (uVar2 != 0x8000002a) {
        wc = uVar2;
      }
      stripctrl_term_put_wc((StripCtrlCharsImpl *)&bs[-7].binarysink_,wc);
    }
  }
  return;
}

Assistant:

static void stripctrl_term_BinarySink_write(
    BinarySink *bs, const void *vp, size_t len)
{
    StripCtrlChars *sccpub = BinarySink_DOWNCAST(bs, StripCtrlChars);
    StripCtrlCharsImpl *scc =
        container_of(sccpub, StripCtrlCharsImpl, public);

    bool utf = in_utf(scc->term);
    if (utf != scc->last_term_utf) {
        scc->last_term_utf = utf;
        scc->utf8.state = 0;
    }

    for (const unsigned char *p = (const unsigned char *)vp;
         len > 0; len--, p++) {
        unsigned long t = scc->translate(scc->term, &scc->utf8, *p);
        if (t == UCSTRUNCATED) {
            stripctrl_term_put_wc(scc, 0xFFFD);
            /* go round again */
            t = scc->translate(scc->term, &scc->utf8, *p);
        }
        if (t == UCSINCOMPLETE)
            continue;
        if (t == UCSINVALID)
            t = 0xFFFD;

        stripctrl_term_put_wc(scc, t);
    }
}